

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cpp
# Opt level: O2

void __thiscall sender::main(sender *this,string *url)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  context *pcVar4;
  src_prop *psVar5;
  ostream *poVar6;
  pools *ppVar7;
  intrusive_ptr<cppcms::application> app;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  shared_ptr<cppcms::application_specific_pool> tgt;
  intrusive_ptr<cppcms::application> local_60;
  shared_ptr<cppcms::http::context> ctx;
  __shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar2 = std::operator!=(url,"/sender");
  if (bVar2) {
    pcVar4 = (context *)cppcms::application::context();
    psVar5 = cppcms::http::context::get_specific<sender::src_prop>(pcVar4);
    if (psVar5 == (src_prop *)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"FAIL: p in line: ");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xe2);
      std::endl<char,std::char_traits<char>>(poVar6);
      g_fail = 1;
      return;
    }
    cppcms::application::response();
    poVar6 = (ostream *)cppcms::http::response::out();
    poVar6 = std::operator<<(poVar6,"async=");
    cppcms::application::is_asynchronous();
    poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
    poVar6 = std::operator<<(poVar6,"\nsrc_async=");
    poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
    poVar6 = std::operator<<(poVar6,"\nsrc_created=");
    poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
    poVar6 = std::operator<<(poVar6,"\nsrc_to_app=");
    poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
    poVar6 = std::operator<<(poVar6,"\npath=");
    poVar6 = std::operator<<(poVar6,(string *)url);
    std::operator<<(poVar6,"\n");
    return;
  }
  psVar5 = (src_prop *)operator_new(3);
  psVar5->src_async = false;
  psVar5->src_created = false;
  psVar5->src_to_app = false;
  pcVar4 = (context *)cppcms::application::context();
  cppcms::http::context::reset_specific<sender::src_prop>(pcVar4,psVar5);
  cppcms::application::request();
  std::__cxx11::string::string((string *)&ctx,"to_app",(allocator *)&tgt);
  cppcms::http::request::get((string *)&local_98);
  bVar2 = std::operator==(&local_98,"1");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&ctx);
  psVar5->src_to_app = bVar2;
  bVar3 = (bool)cppcms::application::is_asynchronous();
  psVar5->src_async = bVar3;
  psVar5->src_created = false;
  tgt.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  tgt.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cppcms::application::request();
  std::__cxx11::string::string((string *)&ctx,"to",(allocator *)&app);
  cppcms::http::request::get((string *)&local_98);
  bVar3 = std::operator==(&local_98,"sync");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&ctx);
  if (bVar3) {
    ppVar7 = this->pools_;
  }
  else {
    ppVar7 = (pools *)&this->pools_->async;
  }
  std::__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> *)
             &local_98,ppVar7);
  std::__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&tgt.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> *)
             &local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
  cppcms::application::release_context();
  if (tgt.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"FAIL: tgt in line: ");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xfa);
    std::endl<char,std::char_traits<char>>(poVar6);
    g_fail = 1;
    goto LAB_0010ef17;
  }
  if (!bVar2) {
    std::__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,
               &tgt.
                super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>);
    std::__cxx11::string::string((string *)&local_98,"/pool",(allocator *)&app);
    cppcms::http::context::submit_to_pool
              (ctx.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_38,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    goto LAB_0010ef17;
  }
  app.p_ = (application *)0x0;
  cppcms::application::service();
  cppcms::service::get_io_service();
  cppcms::application_specific_pool::asynchronous_application_by_io_service((io_service *)&local_98)
  ;
  booster::intrusive_ptr<cppcms::application>::operator=
            (&app,(intrusive_ptr<cppcms::application> *)&local_98);
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
            ((intrusive_ptr<cppcms::application> *)&local_98);
  peVar1 = tgt.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (app.p_ == (application *)0x0) {
    cppcms::application::service();
    cppcms::service::get_io_service();
    cppcms::application::service();
    cppcms::application_specific_pool::asynchronous_application_by_io_service
              ((io_service *)&local_98,(service *)peVar1);
    booster::intrusive_ptr<cppcms::application>::operator=
              (&app,(intrusive_ptr<cppcms::application> *)&local_98);
    booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
              ((intrusive_ptr<cppcms::application> *)&local_98);
    psVar5->src_created = true;
    if (app.p_ != (application *)0x0) goto LAB_0010ee03;
    poVar6 = std::operator<<((ostream *)&std::cerr,"FAIL: app in line: ");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x107);
    std::endl<char,std::char_traits<char>>(poVar6);
    g_fail = 1;
  }
  else {
LAB_0010ee03:
    booster::intrusive_ptr<cppcms::application>::intrusive_ptr(&local_60,&app);
    std::__cxx11::string::string((string *)&local_98,"/app",&local_99);
    cppcms::http::context::submit_to_asynchronous_application
              (ctx.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_60,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_60);
  }
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&app);
LAB_0010ef17:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ctx.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tgt.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void main(std::string url)
	{
		if(url!="/sender") {
			src_prop *p = context().get_specific<src_prop>();
			TESTNT(p);
			response().out() << "async=" << is_asynchronous() << "\n"
			"src_async="  << p->src_async   <<"\n"
			"src_created="<< p->src_created <<"\n"
			"src_to_app=" << p->src_to_app  <<"\n"
			"path="       << url<<"\n"
			;
			return;
		}

		src_prop *p=new src_prop();
		context().reset_specific<src_prop>(p);
		
		bool to_app = request().get("to_app")=="1";
		p->src_to_app = to_app;
		p->src_async = is_asynchronous();
		p->src_created = false;
		booster::shared_ptr<cppcms::application_specific_pool> tgt;
		if(request().get("to")=="sync") 
			tgt = pools_->sync.lock();
		else 
			tgt = pools_->async.lock();

		booster::shared_ptr<cppcms::http::context> ctx = release_context();
		TESTNT(tgt);
		
		if(!to_app) {
			ctx->submit_to_pool(tgt,"/pool");
			return; 
		}
		
		booster::intrusive_ptr<cppcms::application> app;
		app =tgt->asynchronous_application_by_io_service(service().get_io_service());
		if(!app) {
			app = tgt->asynchronous_application_by_io_service(service().get_io_service(),service());
			p->src_created=true;
		}
		TESTNT(app);
		ctx->submit_to_asynchronous_application(app,"/app");
	}